

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Functions.cpp
# Opt level: O0

string_view RenX::getFullTeamName(TeamType team)

{
  string_view sVar1;
  size_t sStack_18;
  TeamType team_local;
  undefined8 local_10;
  
  if (team == GDI) {
    sStack_18 = GDILongName._M_len;
    local_10 = GDILongName._M_str;
  }
  else if (team == Nod) {
    sStack_18 = NodLongName._M_len;
    local_10 = NodLongName._M_str;
  }
  else {
    sStack_18 = OtherLongName._M_len;
    local_10 = OtherLongName._M_str;
  }
  sVar1._M_str = local_10;
  sVar1._M_len = sStack_18;
  return sVar1;
}

Assistant:

std::string_view RenX::getFullTeamName(TeamType team)
{
	switch (team)
	{
	case RenX::TeamType::GDI:
		return GDILongName;
	case RenX::TeamType::Nod:
		return NodLongName;
	default:
		return OtherLongName;
	}
}